

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O0

void __thiscall
olc::TransformedView::DrawSprite
          (TransformedView *this,vf2d *pos,Sprite *sprite,vf2d *scale,uint8_t flip)

{
  PixelGameEngine *this_00;
  uint uVar1;
  Pixel p;
  v2d_generic<int> local_a0;
  v2d_generic<float> local_98;
  v2d_generic<float> local_90;
  vf2d vSample;
  vf2d vPixelStep;
  v2d_generic<float> local_74;
  int local_6c;
  int local_68;
  vi2d vEnd;
  vi2d vStart;
  vi2d vPixel;
  v2d_generic<float> local_4c;
  v2d_generic<float> local_44;
  vf2d vSpriteScaledSize;
  v2d_generic<float> local_34;
  vf2d vSpriteSize;
  uint8_t flip_local;
  vf2d *scale_local;
  Sprite *sprite_local;
  vf2d *pos_local;
  TransformedView *this_local;
  
  vSpriteSize.x._3_1_ = flip;
  unique0x10000260 = scale;
  v2d_generic<float>::v2d_generic(&local_34,(float)sprite->width,(float)sprite->height);
  v2d_generic<float>::operator*(&vSpriteScaledSize,&local_34);
  uVar1 = (*(this->super_PGEX)._vptr_PGEX[10])(this,pos,&vSpriteScaledSize);
  if ((uVar1 & 1) != 0) {
    v2d_generic<float>::operator*((v2d_generic<float> *)&vPixel,&local_34);
    v2d_generic<float>::operator*(&local_4c,(v2d_generic<float> *)&vPixel);
    v2d_generic<float>::operator*(&local_44,&local_4c);
    v2d_generic<int>::v2d_generic(&vStart);
    (*(this->super_PGEX)._vptr_PGEX[5])(&vEnd,this,pos);
    v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&vPixelStep);
    v2d_generic<float>::operator+(&local_74,&local_44);
    v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_6c);
    vSample.x = 1.0;
    operator/((olc *)&vSample.y,&vSample.x,&local_44);
    for (vStart.y = vEnd.y; vStart.y < local_68; vStart.y = vStart.y + 1) {
      for (vStart.x = vEnd.x; vStart.x < local_6c; vStart.x = vStart.x + 1) {
        v2d_generic<int>::operator-(&local_a0,&vStart);
        v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_98);
        v2d_generic<float>::operator*(&local_90,&local_98);
        this_00 = PGEX::pge;
        p = Sprite::Sample(sprite,local_90.x,local_90.y);
        PixelGameEngine::Draw(this_00,&vStart,p);
      }
    }
  }
  return;
}

Assistant:

void TransformedView::DrawSprite(const olc::vf2d & pos, olc::Sprite * sprite, const olc::vf2d & scale, uint8_t flip)
	{
		olc::vf2d vSpriteSize = olc::vf2d(float(sprite->width), float(sprite->height));
		if (IsRectVisible(pos, vSpriteSize * scale))
		{
			olc::vf2d vSpriteScaledSize = vSpriteSize * m_vRecipPixel * m_vWorldScale * scale;
			olc::vi2d vPixel, vStart = WorldToScreen(pos), vEnd = vSpriteScaledSize + vStart;
			olc::vf2d vPixelStep = 1.0f / vSpriteScaledSize;
			for (vPixel.y = vStart.y; vPixel.y < vEnd.y; vPixel.y++)
			{
				for (vPixel.x = vStart.x; vPixel.x < vEnd.x; vPixel.x++)
				{
					olc::vf2d vSample = olc::vf2d(vPixel - vStart) * vPixelStep;
					pge->Draw(vPixel, sprite->Sample(vSample.x, vSample.y));
				}
			}
		}
	}